

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

bool_t xdr_opaque(XDR *__xdrs,caddr_t __cp,u_int __cnt)

{
  xdr_op xVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar2;
  u_int cnt_local;
  char *cp_local;
  XDR *xdrs_local;
  
  xVar1 = __xdrs[2].x_op;
  if (xVar1 == XDR_ENCODE) {
    xdrs_local._7_1_ = xdr_opaque_encode((XDR *)__xdrs,__cp,__cnt);
    uVar2 = CONCAT71(extraout_var_00,xdrs_local._7_1_);
  }
  else if (xVar1 == XDR_DECODE) {
    xdrs_local._7_1_ = xdr_opaque_decode((XDR *)__xdrs,__cp,__cnt);
    uVar2 = CONCAT71(extraout_var,xdrs_local._7_1_);
  }
  else {
    uVar2 = (ulong)(xVar1 - XDR_FREE);
    if (xVar1 - XDR_FREE == 0) {
      xdrs_local._7_1_ = true;
    }
    else {
      uVar2 = 0;
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        uVar2 = (*__ntirpc_pkg_params.warnx_)
                          ("%s:%u ERROR xdrs->x_op (%u)","xdr_opaque",0x213,(ulong)__xdrs[2].x_op);
      }
      xdrs_local._7_1_ = false;
    }
  }
  return (bool_t)CONCAT71((int7)(uVar2 >> 8),xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_opaque(XDR *xdrs, char *cp, u_int cnt)
{
	switch (xdrs->x_op) {
	case XDR_DECODE:
		return (xdr_opaque_decode(xdrs, cp, cnt));
	case XDR_ENCODE:
		return (xdr_opaque_encode(xdrs, cp, cnt));
	case XDR_FREE:
		return (true);
	}

	__warnx(TIRPC_DEBUG_FLAG_ERROR,
		"%s:%u ERROR xdrs->x_op (%u)",
		__func__, __LINE__,
		xdrs->x_op);
	return (false);
}